

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_emu_d3d56.cc
# Opt level: O3

void __thiscall hwtest::pgraph::MthdEmuEmuD3D0Alpha::emulate_mthd(MthdEmuEmuD3D0Alpha *this)

{
  pgraph_state *state;
  byte *pbVar1;
  uint uVar2;
  uint32_t val;
  
  state = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp;
  pgraph_celsius_pre_icmd(state);
  if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource & 2) == 0) {
    uVar2 = (this->super_SingleMthdTest).super_MthdTest.val;
    val = (uVar2 & 0xff |
          (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_a &
          0xffffe000) + (uVar2 + 0xf00 & 0xf00) + 0x1000;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_a = val;
    pgraph_celsius_icmd(state,0x1c,val,true);
  }
  pbVar1 = (byte *)((long)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid + 6)
  ;
  *pbVar1 = *pbVar1 | 4;
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_celsius_pre_icmd(&exp);
		if (!extr(exp.nsource, 1, 1)) {
			insrt(exp.bundle_config_a, 0, 8, val);
			insrt(exp.bundle_config_a, 8, 4, extr(val, 8, 4) - 1);
			insrt(exp.bundle_config_a, 12, 1, 1);
			pgraph_celsius_icmd(&exp, 0x1c, exp.bundle_config_a, true);
		}
		insrt(exp.valid[1], 18, 1, 1);
	}